

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_parser.cc
# Opt level: O3

void __thiscall iqxmlrpc::RequestBuilder::do_visit_element(RequestBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *v;
  string local_30;
  
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 == 5) {
    v = BuilderBase::sub_build<iqxmlrpc::Value_type*,iqxmlrpc::ValueBuilder>
                  (&this->super_BuilderBase,true);
    Value::Value((Value *)&local_30,v);
    std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>::emplace_back<iqxmlrpc::Value>
              (&this->params_,(Value *)&local_30);
    Value::~Value((Value *)&local_30);
  }
  else if (iVar1 == 2) {
    Parser::get_data_abi_cxx11_(&local_30,(this->super_BuilderBase).parser_);
    boost::optional_detail::
    optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::assign(&(this->method_name_).super_type,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
RequestBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case METHOD_NAME:
    method_name_ = parser_.get_data();
    break;

  case VALUE:
    params_.push_back(sub_build<Value_type*, ValueBuilder>(true));
    break;
  }
}